

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::setDefaultOpenGLState(OpenGLRenderer *this)

{
  OpenGLRenderer *this_local;
  
  glBindBuffer(0x8892,this->m_texCoordBuffer);
  glVertexAttribPointer(1,2,0x1406,0,0,0);
  glBindBuffer(0x8892,this->m_vertexBuffer);
  glDisable(0xb71);
  glDisable(0xb90);
  glDepthMask(0);
  glEnable(0xbe2);
  glBlendFunc(1,0x303);
  return;
}

Assistant:

inline void OpenGLRenderer::setDefaultOpenGLState()
{
    // Assign our static texture coordinate buffer to attribute 1.
    glBindBuffer(GL_ARRAY_BUFFER, m_texCoordBuffer);
    glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 0, 0);

    // Bind the vertices
    glBindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);

    // Set our default GL state..
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);
    glDepthMask(false);
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);

}